

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  timespec end;
  timespec start;
  timespec local_38;
  timespec local_28;
  
  clock_gettime(1,&local_28);
  str = "";
  p = "";
  clock_gettime(1,&local_38);
  printf("%s, empty:\n\t %lld\n","main",
         ((local_38.tv_sec - local_28.tv_sec) * 1000000000 + local_38.tv_nsec) - local_28.tv_nsec);
  clock_gettime(1,&local_28);
  str = "aldasdklfa;";
  clock_gettime(1,&local_38);
  printf("%s, str1:\n\t %lld\n","main",
         ((local_38.tv_sec - local_28.tv_sec) * 1000000000 + local_38.tv_nsec) - local_28.tv_nsec);
  clock_gettime(1,&local_28);
  str = 
  "ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;"
  ;
  clock_gettime(1,&local_38);
  printf("%s, str2:\n\t %lld\n","main",
         ((local_38.tv_sec - local_28.tv_sec) * 1000000000 + local_38.tv_nsec) - local_28.tv_nsec);
  clock_gettime(1,&local_28);
  str = 
  "ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj..." /* TRUNCATED STRING LITERAL */
  ;
  clock_gettime(1,&local_38);
  printf("%s, str3:\n\t %lld\n","main",
         ((local_38.tv_sec - local_28.tv_sec) * 1000000000 + local_38.tv_nsec) - local_28.tv_nsec);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i;
    struct timespec start, end;
    long long t;

    clock_gettime(CLOCK_ID, &start);
    str = "";
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, empty:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR1;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str1:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR2;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str2:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR3;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str3:\n\t %lld\n", __func__, t);
    return 0;
}